

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_layout_space_end(nk_context *ctx)

{
  nk_panel *pnVar1;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x45c2,"void nk_layout_space_end(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    pnVar1 = ctx->current->layout;
    if (pnVar1 != (nk_panel *)0x0) {
      (pnVar1->row).item_width = 0.0;
      (pnVar1->row).item_height = 0.0;
      (pnVar1->row).item_offset = 0.0;
      nk_zero(&(pnVar1->row).item,0x10);
      return;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x45c4,"void nk_layout_space_end(struct nk_context *)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x45c3,"void nk_layout_space_end(struct nk_context *)");
}

Assistant:

NK_API void
nk_layout_space_end(struct nk_context *ctx)
{
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    layout->row.item_width = 0;
    layout->row.item_height = 0;
    layout->row.item_offset = 0;
    nk_zero(&layout->row.item, sizeof(layout->row.item));
}